

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makefile.cpp
# Opt level: O1

void __thiscall MakefileGenerator::writeExtraVariables(MakefileGenerator *this,QTextStream *t)

{
  QMakeProject *this_00;
  _List_node_base *p_Var1;
  long lVar2;
  char cVar3;
  ProStringList *pPVar4;
  _Rb_tree_node_base *p_Var5;
  QTextStream *pQVar6;
  _Rb_tree_node_base *p_Var7;
  ProString *this_01;
  long in_FS_OFFSET;
  QRegularExpression rx;
  QString local_d8;
  QStringBuilder<QStringBuilder<QStringBuilder<const_char_(&)[8],_const_ProKey_&>,_const_char_(&)[4]>,_QString>
  local_c0;
  undefined1 *local_90;
  ProString local_88;
  QArrayDataPointer<ProString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  Qt::endl(t);
  local_58.d = (Data *)0x0;
  local_58.ptr = (ProString *)0x0;
  local_58.size = 0;
  this_00 = this->project;
  p_Var1 = (this_00->super_QMakeEvaluator).m_valuemapStack.
           super_list<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>.
           super__List_base<QMap<ProKey,_ProStringList>,_std::allocator<QMap<ProKey,_ProStringList>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  ProKey::ProKey((ProKey *)&local_88,"QMAKE_EXTRA_VARIABLES");
  pPVar4 = QMakeEvaluator::valuesRef(&this_00->super_QMakeEvaluator,(ProKey *)&local_88);
  if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
         -1;
    UNLOCK();
    if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0
       ) {
      QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((pPVar4->super_QList<ProString>).d.size != 0) {
    this_01 = (pPVar4->super_QList<ProString>).d.ptr;
    do {
      local_90 = &DAT_aaaaaaaaaaaaaaaa;
      ProString::toQString(&local_88.m_string,this_01);
      QRegularExpression::fromWildcard
                ((QRegularExpression *)&local_90,local_88.m_string.d.size,local_88.m_string.d.ptr,0,
                 0);
      if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
             + -1;
        UNLOCK();
        if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
            == 0) {
          QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
        }
      }
      lVar2 = (long)p_Var1[1]._M_next;
      if (lVar2 == 0) {
        p_Var5 = (_Rb_tree_node_base *)0x0;
      }
      else {
        p_Var5 = *(_Rb_tree_node_base **)(lVar2 + 0x20);
      }
      while( true ) {
        lVar2 = (long)p_Var1[1]._M_next;
        p_Var7 = (_Rb_tree_node_base *)(lVar2 + 0x10);
        if (lVar2 == 0) {
          p_Var7 = (_Rb_tree_node_base *)0x0;
        }
        if (p_Var5 == p_Var7) break;
        ProString::toQString(&local_88.m_string,(ProString *)(p_Var5 + 1));
        QRegularExpression::match(&local_c0,(QRegularExpression *)&local_90,&local_88,0,0,0);
        cVar3 = QRegularExpressionMatch::hasMatch();
        QRegularExpressionMatch::~QRegularExpressionMatch((QRegularExpressionMatch *)&local_c0);
        if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
               _M_i + -1;
          UNLOCK();
          if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
              _M_i == 0) {
            QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (cVar3 != '\0') {
          ProStringList::join(&local_d8,(ProStringList *)&p_Var5[2]._M_left,(QChar)0x20);
          local_c0.b.d.size = local_d8.d.size;
          local_c0.b.d.ptr = local_d8.d.ptr;
          local_c0.b.d.d = local_d8.d.d;
          local_c0.a.a.a = (char (*) [8])0x2a8fb9;
          local_c0.a.b = (char (*) [4])0x2aa8c2;
          local_d8.d.d = (Data *)0x0;
          local_d8.d.ptr = (char16_t *)0x0;
          local_d8.d.size = 0;
          local_c0.a.a.b = (ProKey *)(p_Var5 + 1);
          ProString::
          ProString<QStringBuilder<QStringBuilder<char_const(&)[8],ProKey_const&>,char_const(&)[4]>,QString>
                    (&local_88,&local_c0);
          QtPrivate::QMovableArrayOps<ProString>::emplace<ProString_const&>
                    ((QMovableArrayOps<ProString> *)&local_58,local_58.size,&local_88);
          QList<ProString>::end((QList<ProString> *)&local_58);
          if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
                 = ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.
                   super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                _M_i == 0) {
              QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_c0.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_c0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_c0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
                 -1;
            UNLOCK();
            if (((local_c0.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
                0) {
              QArrayData::deallocate(&(local_c0.b.d.d)->super_QArrayData,2,0x10);
            }
          }
          if (&(local_d8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_d8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_d8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
      }
      QRegularExpression::~QRegularExpression((QRegularExpression *)&local_90);
      this_01 = this_01 + 1;
    } while (this_01 !=
             (pPVar4->super_QList<ProString>).d.ptr + (pPVar4->super_QList<ProString>).d.size);
  }
  if (local_58.size != 0) {
    QTextStream::operator<<(t,"####### Custom Variables\n");
    ProStringList::join(&local_88.m_string,(ProStringList *)&local_58,(QChar)0xa);
    pQVar6 = (QTextStream *)QTextStream::operator<<(t,(QString *)&local_88);
    pQVar6 = (QTextStream *)Qt::endl(pQVar6);
    Qt::endl(pQVar6);
    if (&(local_88.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i +
           -1;
      UNLOCK();
      if (((local_88.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i ==
          0) {
        QArrayData::deallocate(&(local_88.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  QArrayDataPointer<ProString>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void
MakefileGenerator::writeExtraVariables(QTextStream &t)
{
    t << Qt::endl;

    ProStringList outlist;
    const ProValueMap &vars = project->variables();
    const ProStringList &exports = project->values("QMAKE_EXTRA_VARIABLES");
    for (ProStringList::ConstIterator exp_it = exports.begin(); exp_it != exports.end(); ++exp_it) {
        auto rx = QRegularExpression::fromWildcard((*exp_it).toQString(), Qt::CaseInsensitive);
        for (ProValueMap::ConstIterator it = vars.begin(); it != vars.end(); ++it) {
            if (rx.match(it.key().toQString()).hasMatch())
                outlist << ("EXPORT_" + it.key() + " = " + it.value().join(' '));
        }
    }
    if (!outlist.isEmpty()) {
        t << "####### Custom Variables\n";
        t << outlist.join('\n') << Qt::endl << Qt::endl;
    }
}